

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtCore.c
# Opt level: O0

void Cgt_ClockGatingRangeCheck(Cgt_Man_t *p,int iStart,int nOutputs)

{
  Vec_Ptr_t *vCands;
  Aig_Man_t *pAig;
  Vec_Int_t *vUseful;
  Aig_Obj_t *pMiterPart_00;
  Vec_Vec_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p_01;
  Aig_Obj_t *pCandPart_00;
  int nCalls;
  int RetValue;
  int k;
  int i;
  Aig_Obj_t *pCandPart;
  Aig_Obj_t *pMiterPart;
  Aig_Obj_t *pCandFrame;
  Aig_Obj_t *pMiterFrame;
  Aig_Obj_t *pCand;
  Aig_Obj_t *pMiter;
  Vec_Ptr_t *vNodes;
  int nOutputs_local;
  int iStart_local;
  Cgt_Man_t *p_local;
  
  vCands = p->vFanout;
  iVar1 = Vec_VecSize(p->vGatesAll);
  iVar2 = Aig_ManCoNum(p->pFrame);
  RetValue = iStart;
  if (iVar1 != iVar2) {
    __assert_fail("Vec_VecSize(p->vGatesAll) == Aig_ManCoNum(p->pFrame)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtCore.c"
                  ,0x87,"void Cgt_ClockGatingRangeCheck(Cgt_Man_t *, int, int)");
  }
  do {
    if (iStart + nOutputs <= RetValue) {
      return;
    }
    pObj = Saig_ManLi(p->pAig,RetValue);
    pAig = p->pAig;
    vUseful = p->vUseful;
    pAVar3 = Aig_ObjFanin0(pObj);
    Cgt_ManDetectCandidates(pAig,vUseful,pAVar3,p->pPars->nLevelMax,vCands);
    for (nCalls = 0; iVar1 = Vec_PtrSize(vCands), nCalls < iVar1; nCalls = nCalls + 1) {
      p_01 = (Aig_Obj_t *)Vec_PtrEntry(vCands,nCalls);
      pAVar3 = *(Aig_Obj_t **)((long)(p_01->field_5).pData + 0x28);
      pMiterPart_00 = *(Aig_Obj_t **)((long)(pObj->field_5).pData + 0x28);
      iVar1 = Cgt_SimulationFilter(p,pAVar3,pMiterPart_00);
      if (iVar1 == 0) {
        p->nCallsFiltered = p->nCallsFiltered + 1;
LAB_0060842d:
        pCandPart_00 = Aig_Not(pAVar3);
        iVar1 = Cgt_SimulationFilter(p,pCandPart_00,pMiterPart_00);
        if (iVar1 == 0) {
          p->nCallsFiltered = p->nCallsFiltered + 1;
        }
        else {
          pAVar3 = Aig_Not(pAVar3);
          iVar1 = Cgt_CheckImplication(p,pAVar3,pMiterPart_00);
          if (iVar1 == 1) {
            p_00 = p->vGatesAll;
            pAVar3 = Aig_Not(p_01);
            Vec_VecPush(p_00,RetValue,pAVar3);
          }
          else if (iVar1 == 0) {
            Cgt_SimulationRecord(p);
          }
        }
      }
      else {
        iVar1 = Cgt_CheckImplication(p,pAVar3,pMiterPart_00);
        if (iVar1 != 1) {
          if (iVar1 == 0) {
            Cgt_SimulationRecord(p);
          }
          goto LAB_0060842d;
        }
        Vec_VecPush(p->vGatesAll,RetValue,p_01);
      }
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

void Cgt_ClockGatingRangeCheck( Cgt_Man_t * p, int iStart, int nOutputs )
{
    Vec_Ptr_t * vNodes = p->vFanout;
    Aig_Obj_t * pMiter, * pCand, * pMiterFrame, * pCandFrame, * pMiterPart, * pCandPart;
    int i, k, RetValue, nCalls;
    assert( Vec_VecSize(p->vGatesAll) == Aig_ManCoNum(p->pFrame) );
    // go through all the registers inputs of this range
    for ( i = iStart; i < iStart + nOutputs; i++ )
    {
        nCalls = p->nCalls;
        pMiter = Saig_ManLi( p->pAig, i );
        Cgt_ManDetectCandidates( p->pAig, p->vUseful, Aig_ObjFanin0(pMiter), p->pPars->nLevelMax, vNodes );
        // go through the candidates of this PO
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pCand, k )
        {
            // get the corresponding nodes from the frames
            pCandFrame  = (Aig_Obj_t *)pCand->pData;
            pMiterFrame = (Aig_Obj_t *)pMiter->pData;
            // get the corresponding nodes from the part
            pCandPart   = (Aig_Obj_t *)pCandFrame->pData;
            pMiterPart  = (Aig_Obj_t *)pMiterFrame->pData;
            // try direct polarity
            if ( Cgt_SimulationFilter( p, pCandPart, pMiterPart ) )
            {
                RetValue = Cgt_CheckImplication( p, pCandPart, pMiterPart );
                if ( RetValue == 1 )
                {
                    Vec_VecPush( p->vGatesAll, i, pCand );
                    continue;
                }
                if ( RetValue == 0 )
                    Cgt_SimulationRecord( p );
            }
            else
                p->nCallsFiltered++;
            // try reverse polarity
            if ( Cgt_SimulationFilter( p, Aig_Not(pCandPart), pMiterPart ) )
            {
                RetValue = Cgt_CheckImplication( p, Aig_Not(pCandPart), pMiterPart );
                if ( RetValue == 1 )
                {
                    Vec_VecPush( p->vGatesAll, i, Aig_Not(pCand) );
                    continue;
                }
                if ( RetValue == 0 )
                    Cgt_SimulationRecord( p );
            }
            else
                p->nCallsFiltered++;
        }

        if ( p->pPars->fVerbose )
        {
//            printf( "Flop %3d : Cand = %4d. Gate = %4d. SAT calls = %3d.\n", 
//                i, Vec_PtrSize(vNodes), Vec_PtrSize(Vec_VecEntry(p->vGatesAll, i)), p->nCalls-nCalls );
        }

    }
}